

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser
          (NonBondedInteractionsSectionParser *this,ForceFieldOptions *options)

{
  mapped_type *pmVar1;
  allocator<char> *__a;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffcd8;
  SectionParser *in_stack_fffffffffffffce0;
  allocator<char> *in_stack_fffffffffffffd10;
  key_type *in_stack_fffffffffffffd18;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  SectionParser::SectionParser((SectionParser *)0x24b4ec);
  *in_RDI = &PTR__NonBondedInteractionsSectionParser_00500aa8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
         *)0x24b50f);
  in_RDI[0xb] = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  SectionParser::setSectionName(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = MAW;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = ShiftedMorse;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = LennardJones;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = RepulsiveMorse;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = RepulsivePower;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = Mie;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = Buckingham;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pmVar1 = EAMTable;
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  __k = (key_type *)(in_RDI + 5);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,in_stack_fffffffffffffd10);
  __a = (allocator<char> *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                      *)this_00,__k);
  *(mapped_type *)__a = EAMZhou;
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,__a);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)this_00,__k);
  *pmVar1 = EAMOxides;
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,__a);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
                         *)this_00,__k);
  *pmVar1 = InversePowerSeries;
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  return;
}

Assistant:

NonBondedInteractionsSectionParser::NonBondedInteractionsSectionParser(
      ForceFieldOptions& options) :
      options_(options) {
    setSectionName("NonBondedInteractions");

    stringToEnumMap_["MAW"]                = MAW;
    stringToEnumMap_["ShiftedMorse"]       = ShiftedMorse;
    stringToEnumMap_["LennardJones"]       = LennardJones;
    stringToEnumMap_["RepulsiveMorse"]     = RepulsiveMorse;
    stringToEnumMap_["RepulsivePower"]     = RepulsivePower;
    stringToEnumMap_["Mie"]                = Mie;
    stringToEnumMap_["Buckingham"]         = Buckingham;
    stringToEnumMap_["EAMTable"]           = EAMTable;
    stringToEnumMap_["EAMZhou"]            = EAMZhou;
    stringToEnumMap_["EAMOxides"]          = EAMOxides;
    stringToEnumMap_["InversePowerSeries"] = InversePowerSeries;
  }